

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ReverseLayerParams::~ReverseLayerParams(ReverseLayerParams *this)

{
  Rep *pRVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReverseLayerParams_00702090;
  pRVar1 = (this->reversedim_).rep_;
  if ((pRVar1 != (Rep *)0x0) && (pRVar1->arena == (Arena *)0x0)) {
    operator_delete(pRVar1,(long)(this->reversedim_).total_size_ + 8);
  }
  google::protobuf::internal::
  InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  ::~InternalMetadataWithArenaBase
            (&(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
            );
  return;
}

Assistant:

ReverseLayerParams::~ReverseLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ReverseLayerParams)
  SharedDtor();
}